

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::setFont(QPainter *this,QFont *font)

{
  uint *puVar1;
  uint uVar2;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var3;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> uVar4;
  undefined8 uVar5;
  QPaintDevice *pd;
  long in_FS_OFFSET;
  QFont local_50;
  undefined1 local_40 [20];
  undefined4 local_2c;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var3._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_40._0_4_ = 2;
    local_2c = 0;
    local_40._4_4_ = 0;
    local_40._8_4_ = 0;
    local_40._12_8_ = 0;
    local_28 = "default";
    QMessageLogger::warning(local_40,"QPainter::setFont: Painter not active");
  }
  else {
    QFont::resolve(&local_50,font);
    pd = device(this);
    QFont::QFont((QFont *)local_40,&local_50,pd);
    uVar4._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl = ((_Var3._M_head_impl)->state)._M_t;
    uVar5 = *(undefined8 *)
             ((long)uVar4._M_t.
                    super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x20);
    *(ulong *)((long)uVar4._M_t.
                     super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                     super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                     super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x20) =
         CONCAT44(local_40._4_4_,local_40._0_4_);
    local_40._0_4_ = (undefined4)uVar5;
    local_40._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    uVar2 = *(uint *)((long)uVar4._M_t.
                            super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                            .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x28);
    *(undefined4 *)
     ((long)uVar4._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
            _M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
            super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x28) = local_40._8_4_;
    local_40._8_4_ = uVar2;
    QFont::~QFont((QFont *)local_40);
    QFont::~QFont(&local_50);
    if ((_Var3._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
      puVar1 = (uint *)((long)((_Var3._M_head_impl)->state)._M_t + 8);
      *puVar1 = *puVar1 | 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::setFont(const QFont &font)
{
    Q_D(QPainter);

#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setFont(), family=%s, pointSize=%d\n", font.families().first().toLatin1().constData(), font.pointSize());
#endif

    if (!d->engine) {
        qWarning("QPainter::setFont: Painter not active");
        return;
    }

    d->state->font = QFont(font.resolve(d->state->deviceFont), device());
    if (!d->extended)
        d->state->dirtyFlags |= QPaintEngine::DirtyFont;
}